

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::OptConstFoldUnary
          (GlobOpt *this,Instr **pInstr,int32 intConstantValue,bool isUsingOriginalSrc1Value,
          Value **pDstVal)

{
  OpCode OVar1;
  Opnd *this_00;
  StackSym *pSVar2;
  uint uVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  BailOutKind BVar7;
  uint uVar8;
  uint uVar9;
  JITTimeFunctionBody *this_01;
  undefined4 *puVar10;
  Instr *pIVar11;
  IntConstOpnd *newSrc;
  RegOpnd *pRVar12;
  Value *pVVar13;
  undefined1 *puVar14;
  bool bVar15;
  double local_48;
  
  bVar5 = DoConstFold(this);
  if (!bVar5) {
    return false;
  }
  pIVar11 = *pInstr;
  if (pIVar11->m_dst != (Opnd *)0x0) {
    bVar5 = IR::Opnd::IsRegOpnd(pIVar11->m_dst);
    if (!bVar5) {
      return false;
    }
    pIVar11 = *pInstr;
  }
  OVar1 = pIVar11->m_opcode;
  bVar5 = false;
  if (0x16 < OVar1 - 0x24f) {
    switch(OVar1) {
    case Incr_A:
      uVar3 = intConstantValue + 1;
      if (SCARRY4(intConstantValue,1)) {
        return false;
      }
      break;
    case Decr_A:
      uVar3 = intConstantValue - 1;
      if (SBORROW4(intConstantValue,1)) {
        return false;
      }
      break;
    case Neg_A:
      if ((intConstantValue & 0x7fffffffU) == 0) {
        return false;
      }
      uVar3 = -intConstantValue;
      break;
    case Not_A:
      uVar3 = ~intConstantValue;
      break;
    default:
      if (OVar1 != Conv_Num) {
        if (OVar1 == Ld_A) {
          if ((pIVar11->field_0x38 & 0x10) != 0) {
            BVar7 = IR::Instr::GetBailOutKind(pIVar11);
            if (BVar7 == BailOutExpectingString) {
              puVar14 = (undefined1 *)__cxa_allocate_exception(1);
              *puVar14 = 0x23;
              __cxa_throw(puVar14,&Js::RejitException::typeinfo,0);
            }
            BVar7 = IR::Instr::GetBailOutKind(*pInstr);
            if (BVar7 != BailOutExpectingInteger) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar10 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x1c2d,"(instr->GetBailOutKind() == IR::BailOutExpectingInteger)",
                                 "instr->GetBailOutKind() == IR::BailOutExpectingInteger");
              if (!bVar5) goto LAB_0043015a;
              *puVar10 = 0;
            }
            IR::Instr::ClearBailOutInfo(*pInstr);
          }
        }
        else {
          if (OVar1 == ToVar) goto switchD_0042fa4e_caseD_25e;
          if (OVar1 != LdC_A_I4) {
            return false;
          }
        }
      }
      bVar15 = !isUsingOriginalSrc1Value;
      bVar5 = true;
      local_48 = 0.0;
      goto LAB_0042fd44;
    }
    goto LAB_0042fd35;
  }
  local_48 = (double)intConstantValue;
  switch((uint)OVar1) {
  case 0x24f:
    local_48 = Js::Math::Acos(local_48);
    break;
  case 0x250:
    local_48 = Js::Math::Asin(local_48);
    break;
  case 0x251:
    local_48 = Js::Math::Atan(local_48);
    break;
  default:
    goto switchD_0042fa4e_caseD_252;
  case 0x253:
    local_48 = Js::Math::Cos(local_48);
    break;
  case 0x254:
    local_48 = Js::Math::Exp(local_48);
    break;
  case 0x255:
    local_48 = Js::Math::Log(local_48);
    break;
  case 599:
    local_48 = Js::Math::Sin(local_48);
    break;
  case 600:
    if (local_48 < 0.0) {
      local_48 = sqrt(local_48);
    }
    else {
      local_48 = SQRT(local_48);
    }
    break;
  case 0x259:
    local_48 = tan(local_48);
    break;
  case 0x25a:
    uVar3 = intConstantValue;
    if (intConstantValue < 1) {
      uVar3 = -intConstantValue;
    }
    goto LAB_0042fd35;
  case 0x25b:
    if (intConstantValue == 0) {
      intConstantValue = 0x20;
    }
    else {
      uVar3 = 0x1f;
      if (intConstantValue != 0) {
        for (; (uint)intConstantValue >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      intConstantValue = uVar3 ^ 0x1f;
    }
  case 0x25e:
  case 0x25f:
  case 0x264:
switchD_0042fa4e_caseD_25e:
    IR::Instr::ClearBailOutInfo(pIVar11);
    uVar3 = intConstantValue;
LAB_0042fd35:
    intConstantValue = uVar3;
    local_48 = 0.0;
    bVar15 = true;
    bVar5 = true;
    goto LAB_0042fd44;
  case 0x25c:
    this_01 = Func::GetJITFunctionBody(this->func);
    bVar5 = JITTimeFunctionBody::IsWasmFunction(this_01);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1ca3,"(func->GetJITFunctionBody()->IsWasmFunction())",
                         "func->GetJITFunctionBody()->IsWasmFunction()");
      if (!bVar5) goto LAB_0043015a;
      *puVar10 = 0;
    }
    if (((*pInstr)->field_0x38 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1ca4,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
      if (!bVar5) goto LAB_0043015a;
      *puVar10 = 0;
    }
    if (intConstantValue == 0) {
      uVar3 = 0x20;
    }
    else {
      uVar3 = 0;
      if (intConstantValue != 0) {
        for (; ((uint)intConstantValue >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
    }
    goto LAB_0042fd35;
  case 0x265:
    local_48 = (double)intConstantValue;
  }
  bVar15 = true;
  intConstantValue = 0;
  bVar5 = false;
LAB_0042fd44:
  CaptureByteCodeSymUses(this,*pInstr);
  if (((*pInstr)->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1ccf,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar6) goto LAB_0043015a;
    *puVar10 = 0;
  }
  if (bVar5) {
    pIVar11 = *pInstr;
LAB_0042fe01:
    newSrc = IR::IntConstOpnd::New((long)intConstantValue,TyInt32,pIVar11->m_func,false);
    uVar8 = Func::GetSourceContextId(this->func);
    uVar9 = Func::GetLocalFunctionId(this->func);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar8,uVar9);
    bVar5 = true;
    if (bVar6) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(L"Constant folding to %d\n",(ulong)(uint)intConstantValue);
      bVar5 = true;
LAB_0042feb5:
      Output::Flush();
    }
  }
  else {
    intConstantValue = (int32)local_48;
    pIVar11 = *pInstr;
    if ((local_48 == (double)(int)local_48) && (!NAN(local_48) && !NAN((double)(int)local_48)))
    goto LAB_0042fe01;
    newSrc = (IntConstOpnd *)IR::FloatConstOpnd::New(local_48,TyFloat64,pIVar11->m_func);
    uVar8 = Func::GetSourceContextId(this->func);
    uVar9 = Func::GetLocalFunctionId(this->func);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar8,uVar9);
    if (bVar5) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      bVar5 = false;
      Output::Print(L": ");
      Output::Print(L"Constant folding to %f\n",local_48._0_4_);
      goto LAB_0042feb5;
    }
    bVar5 = false;
  }
  IR::Instr::ReplaceSrc1(*pInstr,&newSrc->super_Opnd);
  OptSrc(this,&newSrc->super_Opnd,pInstr,(Value **)0x0,(IndirOpnd *)0x0);
  this_00 = (*pInstr)->m_dst;
  bVar6 = IR::Opnd::IsRegOpnd(this_00);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1ce8,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
    if (!bVar6) {
LAB_0043015a:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar10 = 0;
  }
  pRVar12 = IR::Opnd::AsRegOpnd(this_00);
  if (bVar5) {
    pSVar2 = pRVar12->m_sym;
    if (((pSVar2->field_0x18 & 1) != 0) && ((pSVar2->field_5).m_instrDef != (Instr *)0x0)) {
      StackSym::SetIsIntConst(pSVar2,(long)intConstantValue);
    }
    if (bVar15) {
      pVVar13 = GetIntConstantValue(this,intConstantValue,*pInstr,this_00);
      *pDstVal = pVVar13;
    }
    bVar5 = IsTypeSpecPhaseOff(this->func);
    pIVar11 = *pInstr;
    if (bVar5) {
      pIVar11->m_opcode = LdC_A_I4;
LAB_004300a8:
      pRVar12 = IR::Opnd::AsRegOpnd(this_00);
      ToVarRegOpnd(this,pRVar12,this->currentBlock);
    }
    else {
      pIVar11->m_opcode = Ld_I4;
      pRVar12 = IR::Opnd::AsRegOpnd(this_00);
      ToInt32Dst(this,pIVar11,pRVar12,this->currentBlock);
      pRVar12 = IR::Opnd::AsRegOpnd((*pInstr)->m_dst);
      pSVar2 = pRVar12->m_sym;
      if (((pSVar2->field_0x18 & 1) != 0) && ((pSVar2->field_5).m_instrDef != (Instr *)0x0)) {
        StackSym::SetIsIntConst(pSVar2,(long)intConstantValue);
      }
    }
  }
  else {
    pVVar13 = NewFloatConstantValue(this,local_48,this_00);
    *pDstVal = pVVar13;
    bVar5 = IsTypeSpecPhaseOff(this->func);
    pIVar11 = *pInstr;
    if (bVar5) {
      pIVar11->m_opcode = LdC_A_R8;
      goto LAB_004300a8;
    }
    pIVar11->m_opcode = LdC_F8_R8;
    pRVar12 = IR::Opnd::AsRegOpnd(this_00);
    ToFloat64Dst(this,pIVar11,pRVar12,this->currentBlock);
  }
  InvalidateInductionVariables(this,*pInstr);
  bVar5 = true;
switchD_0042fa4e_caseD_252:
  return bVar5;
}

Assistant:

bool
GlobOpt::OptConstFoldUnary(
    IR::Instr * *pInstr,
    const int32 intConstantValue,
    const bool isUsingOriginalSrc1Value,
    Value **pDstVal)
{
    IR::Instr * &instr = *pInstr;
    int32 value = 0;
    IR::Opnd *constOpnd;
    bool isInt = true;
    bool doSetDstVal = true;
    FloatConstType fValue = 0.0;

    if (!DoConstFold())
    {
        return false;
    }

    if (instr->GetDst() && !instr->GetDst()->IsRegOpnd())
    {
        return false;
    }

    switch(instr->m_opcode)
    {
    case Js::OpCode::Neg_A:
        if (intConstantValue == 0)
        {
            // Could fold to -0.0
            return false;
        }

        if (Int32Math::Neg(intConstantValue, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::Not_A:
        Int32Math::Not(intConstantValue, &value);
        break;

    case Js::OpCode::Ld_A:
        if (instr->HasBailOutInfo())
        {
            //The profile data for switch expr can be string and in GlobOpt we realize it is an int.
            if(instr->GetBailOutKind() == IR::BailOutExpectingString)
            {
                throw Js::RejitException(RejitReason::DisableSwitchOptExpectingString);
            }
            Assert(instr->GetBailOutKind() == IR::BailOutExpectingInteger);
            instr->ClearBailOutInfo();
        }
        value = intConstantValue;
        if(isUsingOriginalSrc1Value)
        {
            doSetDstVal = false;  // Let OptDst do it by copying src1Val
        }
        break;

    case Js::OpCode::Conv_Num:
    case Js::OpCode::LdC_A_I4:
        value = intConstantValue;
        if(isUsingOriginalSrc1Value)
        {
            doSetDstVal = false;  // Let OptDst do it by copying src1Val
        }
        break;

    case Js::OpCode::Incr_A:
        if (Int32Math::Inc(intConstantValue, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::Decr_A:
        if (Int32Math::Dec(intConstantValue, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::InlineMathAcos:
        fValue = Js::Math::Acos((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathAsin:
        fValue = Js::Math::Asin((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathAtan:
        fValue = Js::Math::Atan((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathCos:
        fValue = Js::Math::Cos((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathExp:
        fValue = Js::Math::Exp((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathLog:
        fValue = Js::Math::Log((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathSin:
        fValue = Js::Math::Sin((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathSqrt:
        fValue = ::sqrt((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathTan:
        fValue = ::tan((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathFround:
        fValue = (double) (float) intConstantValue;
        isInt = false;
        break;

    case Js::OpCode::InlineMathAbs:
        if (intConstantValue == INT32_MIN)
        {
            if (instr->GetDst()->IsInt32())
            {
                // if dst is an int (e.g. in asm.js), we should coerce it, not convert to float
                value = static_cast<int32>(2147483648U);
            }
            else
            {
                // Rejit with AggressiveIntTypeSpecDisabled for Math.abs(INT32_MIN) because it causes dst
                // to be float type which could be different with previous type spec result in LoopPrePass
                throw Js::RejitException(RejitReason::AggressiveIntTypeSpecDisabled);
            }
        }
        else
        {
            value = ::abs(intConstantValue);
        }
        break;

    case Js::OpCode::InlineMathClz:
        DWORD clz;
        if (_BitScanReverse(&clz, intConstantValue))
        {
            value = 31 - clz;
        }
        else
        {
            value = 32;
        }
        instr->ClearBailOutInfo();
        break;

    case Js::OpCode::Ctz:
        Assert(func->GetJITFunctionBody()->IsWasmFunction());
        Assert(!instr->HasBailOutInfo());
        DWORD ctz;
        if (_BitScanForward(&ctz, intConstantValue))
        {
            value = ctz;
        }
        else
        {
            value = 32;
        }
        break;

    case Js::OpCode::InlineMathFloor:
        value = intConstantValue;
        instr->ClearBailOutInfo();
        break;

    case Js::OpCode::InlineMathCeil:
        value = intConstantValue;
        instr->ClearBailOutInfo();
        break;

    case Js::OpCode::InlineMathRound:
        value = intConstantValue;
        instr->ClearBailOutInfo();
        break;
    case Js::OpCode::ToVar:
        if (Js::TaggedInt::IsOverflow(intConstantValue))
        {
            return false;
        }
        else
        {
            value = intConstantValue;
            instr->ClearBailOutInfo();
            break;
        }
    default:
        return false;
    }

    this->CaptureByteCodeSymUses(instr);

    Assert(!instr->HasBailOutInfo()); // If we are, in fact, successful in constant folding the instruction, there is no point in having the bailoutinfo around anymore.
                                      // Make sure that it is cleared if it was initially present.
    if (!isInt)
    {
        value = (int32)fValue;
        if (fValue == (double)value)
        {
            isInt = true;
        }
    }
    if (isInt)
    {
        constOpnd = IR::IntConstOpnd::New(value, TyInt32, instr->m_func);
        GOPT_TRACE(_u("Constant folding to %d\n"), value);
    }
    else
    {
        constOpnd = IR::FloatConstOpnd::New(fValue, TyFloat64, instr->m_func);
        GOPT_TRACE(_u("Constant folding to %f\n"), fValue);
    }
    instr->ReplaceSrc1(constOpnd);

    this->OptSrc(constOpnd, &instr);

    IR::Opnd *dst = instr->GetDst();
    Assert(dst->IsRegOpnd());

    StackSym *dstSym = dst->AsRegOpnd()->m_sym;

    if (isInt)
    {
        if (dstSym->IsSingleDef())
        {
            dstSym->SetIsIntConst(value);
        }

        if (doSetDstVal)
        {
            *pDstVal = GetIntConstantValue(value, instr, dst);
        }

        if (IsTypeSpecPhaseOff(this->func))
        {
            instr->m_opcode = Js::OpCode::LdC_A_I4;
            this->ToVarRegOpnd(dst->AsRegOpnd(), this->currentBlock);
        }
        else
        {
            instr->m_opcode = Js::OpCode::Ld_I4;
            this->ToInt32Dst(instr, dst->AsRegOpnd(), this->currentBlock);

            StackSym * currDstSym = instr->GetDst()->AsRegOpnd()->m_sym;
            if (currDstSym->IsSingleDef())
            {
                currDstSym->SetIsIntConst(value);
            }
        }
    }
    else
    {
        *pDstVal = NewFloatConstantValue(fValue, dst);

        if (IsTypeSpecPhaseOff(this->func))
        {
            instr->m_opcode = Js::OpCode::LdC_A_R8;
            this->ToVarRegOpnd(dst->AsRegOpnd(), this->currentBlock);
        }
        else
        {
            instr->m_opcode = Js::OpCode::LdC_F8_R8;
            this->ToFloat64Dst(instr, dst->AsRegOpnd(), this->currentBlock);
        }
    }

    InvalidateInductionVariables(instr);

    return true;
}